

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O0

bool __thiscall CommandOptions::set_video_ref(CommandOptions *this,string *arg)

{
  size_type sVar1;
  char *pcVar2;
  long lVar3;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ref_tokens;
  string *arg_local;
  CommandOptions *this_local;
  
  ref_tokens.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,",",&local_59);
  Kumu::km_token_split((string *)local_38,(string *)arg);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  sVar1 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
  if (sVar1 != 1) {
    if (sVar1 != 2) {
      if (sVar1 != 3) {
        fprintf(_stderr,"Expecting <white-ref>[,<black-ref>[,<color-range>]]\n");
        this_local._7_1_ = false;
        goto LAB_00124b0e;
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      lVar3 = strtol(pcVar2,(char **)0x0,10);
      lVar3 = Kumu::xabs<long>(lVar3);
      this->cdci_ColorRange = (ui32_t)lVar3;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    lVar3 = strtol(pcVar2,(char **)0x0,10);
    lVar3 = Kumu::xabs<long>(lVar3);
    this->cdci_BlackRefLevel = (ui32_t)lVar3;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  lVar3 = strtol(pcVar2,(char **)0x0,10);
  lVar3 = Kumu::xabs<long>(lVar3);
  this->cdci_WhiteRefLevel = (ui32_t)lVar3;
  if (((this->cdci_WhiteRefLevel < 0x10000) && (this->cdci_BlackRefLevel < 0x10000)) &&
     (this->cdci_ColorRange < 0x10000)) {
    this_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Unexpected CDCI video referece levels.\n");
    this_local._7_1_ = false;
  }
LAB_00124b0e:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_38);
  return this_local._7_1_;
}

Assistant:

bool set_video_ref(const std::string& arg)
  {
    std::list<std::string> ref_tokens = Kumu::km_token_split(arg, ",");

    switch ( ref_tokens.size() )
      {
      case 3:
	cdci_ColorRange = Kumu::xabs(strtol(ref_tokens.back().c_str(), 0, 10));
	ref_tokens.pop_back();
      case 2:
	cdci_BlackRefLevel = Kumu::xabs(strtol(ref_tokens.back().c_str(), 0, 10));
	ref_tokens.pop_back();
      case 1:
	cdci_WhiteRefLevel = Kumu::xabs(strtol(ref_tokens.back().c_str(), 0, 10));
	break;

      default:
	fprintf(stderr, "Expecting <white-ref>[,<black-ref>[,<color-range>]]\n");
	return false;
      }

    if ( cdci_WhiteRefLevel > 65535 || cdci_BlackRefLevel > 65535 || cdci_ColorRange > 65535 )
      {
	fprintf(stderr, "Unexpected CDCI video referece levels.\n");
	return false;
      }

    return true;
  }